

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a3d2::ARTKeyEncodeDecodeTest_AppendSpanConstByteC0001_Test::TestBody
          (ARTKeyEncodeDecodeTest_AppendSpanConstByteC0001_Test *this)

{
  __extent_storage<18446744073709551615UL> extraout_RDX;
  __extent_storage<18446744073709551615UL> extraout_RDX_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  __extent_storage<18446744073709551615UL> extraout_RDX_03;
  __extent_storage<18446744073709551615UL> extraout_RDX_04;
  __extent_storage<18446744073709551615UL> extraout_RDX_05;
  __extent_storage<18446744073709551615UL> extraout_RDX_06;
  span<const_std::byte,_18446744073709551615UL> a;
  span<const_std::byte,_18446744073709551615UL> a_00;
  span<const_std::byte,_18446744073709551615UL> a_01;
  span<const_std::byte,_18446744073709551615UL> a_02;
  span<const_std::byte,_18446744073709551615UL> a_03;
  span<const_std::byte,_18446744073709551615UL> a_04;
  span<const_std::byte,_18446744073709551615UL> a_05;
  span<const_std::byte,_18446744073709551615UL> a_06;
  span<const_std::byte,_18446744073709551615UL> local_a8;
  span<const_std::byte,_18446744073709551615UL> local_98;
  span<const_std::byte,_18446744073709551615UL> local_88;
  span<const_std::byte,_18446744073709551615UL> local_78;
  span<const_std::byte,_18446744073709551615UL> local_68;
  span<const_std::byte,_18446744073709551615UL> local_58;
  span<const_std::byte,_18446744073709551615UL> local_48;
  span<const_std::byte,_18446744073709551615UL> local_38;
  array<const_std::byte,_3UL> local_28;
  array<const_std::byte,_3UL> local_25;
  undefined1 local_22 [2];
  array<const_std::byte,_3UL> test_data_7;
  array<const_std::byte,_3UL> test_data_6;
  array<const_std::byte,_3UL> test_data_5;
  array<const_std::byte,_3UL> test_data_4;
  array<const_std::byte,_3UL> test_data_3;
  array<const_std::byte,_3UL> test_data_2;
  array<const_std::byte,_3UL> test_data_1;
  array<const_std::byte,_3UL> test_data_0;
  ARTKeyEncodeDecodeTest_AppendSpanConstByteC0001_Test *this_local;
  
  test_data_3._M_elems[1] = 2;
  test_data_3._M_elems[2] = 5;
  test_data_4._M_elems[1] = 3;
  test_data_4._M_elems[2] = 0;
  test_data_3._M_elems[0] = 5;
  test_data_5._M_elems[1] = 3;
  test_data_5._M_elems[2] = 0;
  test_data_4._M_elems[0] = 0x10;
  test_data_6._M_elems[1] = 3;
  test_data_6._M_elems[2] = 5;
  test_data_5._M_elems[0] = 5;
  test_data_7._M_elems[1] = 3;
  test_data_7._M_elems[2] = 5;
  test_data_6._M_elems[0] = 0x10;
  local_22[0] = 3;
  local_22[1] = 0x10;
  test_data_7._M_elems[0] = 5;
  local_25._M_elems[0] = 4;
  local_25._M_elems[1] = 5;
  local_25._M_elems[2] = 0x10;
  local_28._M_elems[0] = 4;
  local_28._M_elems[1] = 0x10;
  local_28._M_elems[2] = 5;
  std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte,_3UL>
            (&local_38,(array<const_std::byte,_3UL> *)(test_data_3._M_elems + 1));
  a._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  a._M_ptr = (pointer)local_38._M_extent._M_extent_value;
  do_encode_bytes_test((anon_unknown_dwarf_a3d2 *)local_38._M_ptr,a);
  std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte,_3UL>
            (&local_48,(array<const_std::byte,_3UL> *)(test_data_4._M_elems + 1));
  a_00._M_extent._M_extent_value = extraout_RDX_00._M_extent_value;
  a_00._M_ptr = (pointer)local_48._M_extent._M_extent_value;
  do_encode_bytes_test((anon_unknown_dwarf_a3d2 *)local_48._M_ptr,a_00);
  std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte,_3UL>
            (&local_58,(array<const_std::byte,_3UL> *)(test_data_5._M_elems + 1));
  a_01._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
  a_01._M_ptr = (pointer)local_58._M_extent._M_extent_value;
  do_encode_bytes_test((anon_unknown_dwarf_a3d2 *)local_58._M_ptr,a_01);
  std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte,_3UL>
            (&local_68,(array<const_std::byte,_3UL> *)(test_data_6._M_elems + 1));
  a_02._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
  a_02._M_ptr = (pointer)local_68._M_extent._M_extent_value;
  do_encode_bytes_test((anon_unknown_dwarf_a3d2 *)local_68._M_ptr,a_02);
  std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte,_3UL>
            (&local_78,(array<const_std::byte,_3UL> *)(test_data_7._M_elems + 1));
  a_03._M_extent._M_extent_value = extraout_RDX_03._M_extent_value;
  a_03._M_ptr = (pointer)local_78._M_extent._M_extent_value;
  do_encode_bytes_test((anon_unknown_dwarf_a3d2 *)local_78._M_ptr,a_03);
  std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte,_3UL>
            (&local_88,(array<const_std::byte,_3UL> *)local_22);
  a_04._M_extent._M_extent_value = extraout_RDX_04._M_extent_value;
  a_04._M_ptr = (pointer)local_88._M_extent._M_extent_value;
  do_encode_bytes_test((anon_unknown_dwarf_a3d2 *)local_88._M_ptr,a_04);
  std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte,_3UL>
            (&local_98,&local_25);
  a_05._M_extent._M_extent_value = extraout_RDX_05._M_extent_value;
  a_05._M_ptr = (pointer)local_98._M_extent._M_extent_value;
  do_encode_bytes_test((anon_unknown_dwarf_a3d2 *)local_98._M_ptr,a_05);
  std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte,_3UL>
            (&local_a8,&local_28);
  a_06._M_extent._M_extent_value = extraout_RDX_06._M_extent_value;
  a_06._M_ptr = (pointer)local_a8._M_extent._M_extent_value;
  do_encode_bytes_test((anon_unknown_dwarf_a3d2 *)local_a8._M_ptr,a_06);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, AppendSpanConstByteC0001) {
  constexpr auto test_data_0 = std::array<const std::byte, 3>{
      std::byte{0x02}, std::byte{0x05}, std::byte{0x05}};
  constexpr auto test_data_1 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x00}, std::byte{0x05}};
  constexpr auto test_data_2 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x00}, std::byte{0x10}};
  constexpr auto test_data_3 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x05}, std::byte{0x05}};
  constexpr auto test_data_4 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x05}, std::byte{0x10}};
  constexpr auto test_data_5 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x10}, std::byte{0x05}};
  constexpr auto test_data_6 = std::array<const std::byte, 3>{
      std::byte{0x04}, std::byte{0x05}, std::byte{0x10}};
  constexpr auto test_data_7 = std::array<const std::byte, 3>{
      std::byte{0x04}, std::byte{0x10}, std::byte{0x05}};

  do_encode_bytes_test(std::span<const std::byte>(test_data_0));
  do_encode_bytes_test(std::span<const std::byte>(test_data_1));
  do_encode_bytes_test(std::span<const std::byte>(test_data_2));
  do_encode_bytes_test(std::span<const std::byte>(test_data_3));
  do_encode_bytes_test(std::span<const std::byte>(test_data_4));
  do_encode_bytes_test(std::span<const std::byte>(test_data_5));
  do_encode_bytes_test(std::span<const std::byte>(test_data_6));
  do_encode_bytes_test(std::span<const std::byte>(test_data_7));
}